

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_3_2::jacobiSVD<double>
               (Matrix44<double> *A,Matrix44<double> *U,Vec4<double> *S,Matrix44<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int i_2;
  double (*padVar9) [4];
  long lVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  uint uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  Vec4<double> uCol;
  double local_f8 [4];
  double local_d8 [4];
  Matrix44<double> local_b8;
  
  padVar9 = (double (*) [4])&local_b8;
  local_b8.x[0][0] = A->x[0][0];
  local_b8.x[0][1] = A->x[0][1];
  local_b8.x[0][2] = A->x[0][2];
  local_b8.x[0][3] = A->x[0][3];
  local_b8.x[1][0] = A->x[1][0];
  local_b8.x[1][1] = A->x[1][1];
  local_b8.x[1][2] = A->x[1][2];
  local_b8.x[1][3] = A->x[1][3];
  local_b8.x[2][0] = A->x[2][0];
  local_b8.x[2][1] = A->x[2][1];
  local_b8.x[2][2] = A->x[2][2];
  local_b8.x[2][3] = A->x[2][3];
  local_b8.x[3][0] = A->x[3][0];
  local_b8.x[3][1] = A->x[3][1];
  local_b8.x[3][2] = A->x[3][2];
  local_b8.x[3][3] = A->x[3][3];
  U->x[0][0] = 1.0;
  pdVar1 = U->x[0] + 1;
  U->x[0][1] = 0.0;
  U->x[0][2] = 0.0;
  U->x[0][3] = 0.0;
  U->x[1][0] = 0.0;
  U->x[1][1] = 1.0;
  U->x[1][2] = 0.0;
  U->x[1][3] = 0.0;
  U->x[2][0] = 0.0;
  U->x[2][1] = 0.0;
  U->x[2][2] = 1.0;
  U->x[2][3] = 0.0;
  U->x[3][0] = 0.0;
  U->x[3][1] = 0.0;
  U->x[3][2] = 0.0;
  U->x[3][3] = 1.0;
  V->x[0][0] = 1.0;
  pdVar2 = V->x[0] + 1;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[0][3] = 0.0;
  V->x[1][0] = 0.0;
  V->x[1][1] = 1.0;
  V->x[1][2] = 0.0;
  V->x[1][3] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[2][2] = 1.0;
  V->x[2][3] = 0.0;
  V->x[3][0] = 0.0;
  V->x[3][1] = 0.0;
  V->x[3][2] = 0.0;
  V->x[3][3] = 1.0;
  dVar22 = 0.0;
  lVar10 = 0;
  do {
    lVar12 = 0;
    dVar21 = dVar22;
    do {
      dVar22 = dVar21;
      if ((lVar10 != lVar12) &&
         (dVar22 = ABS((*(double (*) [4])*padVar9)[lVar12]), dVar22 <= dVar21)) {
        dVar22 = dVar21;
      }
      lVar12 = lVar12 + 1;
      dVar21 = dVar22;
    } while (lVar12 != 4);
    lVar10 = lVar10 + 1;
    padVar9 = padVar9 + 1;
  } while (lVar10 != 4);
  dVar22 = dVar22 * tol;
  if ((dVar22 != 0.0) || (NAN(dVar22))) {
    uVar18 = 0;
    while( true ) {
      bVar3 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b8,0,1,U,V,tol);
      bVar4 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b8,0,2,U,V,tol);
      bVar5 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b8,0,3,U,V,tol);
      bVar6 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b8,1,2,U,V,tol);
      bVar7 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b8,1,3,U,V,tol);
      bVar8 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b8,2,3,U,V,tol);
      if (((((!bVar8) && (!bVar7)) && (!bVar6)) && ((!bVar5 && (!bVar3)))) && (!bVar4)) break;
      uVar19 = 0;
      uVar20 = 0;
      padVar9 = (double (*) [4])&local_b8;
      lVar10 = 0;
      do {
        lVar12 = 0;
        do {
          if (lVar10 != lVar12) {
            dVar21 = ABS((*(double (*) [4])*padVar9)[lVar12]);
            if (dVar21 <= (double)CONCAT44(uVar20,uVar19)) {
              dVar21 = (double)CONCAT44(uVar20,uVar19);
            }
            uVar19 = SUB84(dVar21,0);
            uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        lVar10 = lVar10 + 1;
        padVar9 = padVar9 + 1;
      } while (lVar10 != 4);
      if (((double)CONCAT44(uVar20,uVar19) < dVar22 || (double)CONCAT44(uVar20,uVar19) == dVar22) ||
         (bVar3 = 0x12 < uVar18, uVar18 = uVar18 + 1, bVar3)) break;
    }
  }
  S->x = local_b8.x[0][0];
  S->y = local_b8.x[1][1];
  S->z = local_b8.x[2][2];
  S->w = local_b8.x[3][3];
  lVar10 = 0;
  pdVar11 = (double *)U;
  do {
    if ((&S->x)[lVar10] < 0.0) {
      (&S->x)[lVar10] = -(&S->x)[lVar10];
      lVar12 = 0;
      do {
        *(ulong *)((long)pdVar11 + lVar12) = *(ulong *)((long)pdVar11 + lVar12) ^ 0x8000000000000000
        ;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x80);
    }
    lVar10 = lVar10 + 1;
    pdVar11 = pdVar11 + 1;
  } while (lVar10 != 4);
  lVar10 = 1;
  lVar12 = 0;
  pdVar11 = pdVar2;
  pdVar13 = pdVar1;
  do {
    local_d8[0] = U->x[0][lVar10];
    local_d8[1] = U->x[1][lVar10];
    local_d8[2] = U->x[2][lVar10];
    local_d8[3] = U->x[3][lVar10];
    local_f8[0] = V->x[0][lVar10];
    local_f8[1] = V->x[1][lVar10];
    local_f8[2] = V->x[2][lVar10];
    local_f8[3] = V->x[3][lVar10];
    dVar22 = (&S->x)[lVar10];
    lVar14 = lVar12;
    pdVar15 = pdVar11;
    pdVar16 = pdVar13;
    do {
      if (ABS(dVar22) <= ABS((&S->x)[lVar14])) goto LAB_00106ee7;
      lVar17 = 0;
      do {
        *(undefined8 *)((long)pdVar16 + lVar17) = *(undefined8 *)((long)pdVar16 + lVar17 + -8);
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0x80);
      lVar17 = 0;
      do {
        *(undefined8 *)((long)pdVar15 + lVar17) = *(undefined8 *)((long)pdVar15 + lVar17 + -8);
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0x80);
      (&S->y)[lVar14] = (&S->x)[lVar14];
      pdVar16 = pdVar16 + -1;
      pdVar15 = pdVar15 + -1;
      bVar3 = 0 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar3);
    lVar14 = -1;
LAB_00106ee7:
    lVar14 = (long)(int)lVar14;
    lVar17 = 0;
    do {
      *(undefined8 *)((long)pdVar1 + lVar17 * 4 + lVar14 * 8) =
           *(undefined8 *)((long)local_d8 + lVar17);
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x20);
    lVar17 = 0;
    do {
      *(undefined8 *)((long)pdVar2 + lVar17 * 4 + lVar14 * 8) =
           *(undefined8 *)((long)local_f8 + lVar17);
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x20);
    (&S->y)[lVar14] = dVar22;
    lVar10 = lVar10 + 1;
    lVar12 = lVar12 + 1;
    pdVar13 = pdVar13 + 1;
    pdVar11 = pdVar11 + 1;
    if (lVar12 == 3) {
      if (forcePositiveDeterminant) {
        dVar22 = Matrix44<double>::determinant(U);
        if (dVar22 < 0.0) {
          lVar10 = 0;
          do {
            *(ulong *)((long)U->x[0] + lVar10 + 0x18) =
                 *(ulong *)((long)U->x[0] + lVar10 + 0x18) ^ 0x8000000000000000;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x80);
          S->w = -S->w;
        }
        dVar22 = Matrix44<double>::determinant(V);
        if (dVar22 < 0.0) {
          lVar10 = 0;
          do {
            *(ulong *)((long)V->x[0] + lVar10 + 0x18) =
                 *(ulong *)((long)V->x[0] + lVar10 + 0x18) ^ 0x8000000000000000;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x80);
          S->w = -S->w;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}